

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O3

void * outlet_anything(void *x,t_symbol *s,short ac,t_atom *av)

{
  t_mock_outlet *this;
  undefined8 *puVar1;
  
  puVar1 = DAT_001144c8;
  do {
    if (puVar1 == (undefined8 *)0x0) {
      return (void *)0x1;
    }
    for (this = (t_mock_outlet *)puVar1[2]; this != (t_mock_outlet *)puVar1[3]; this = this + 1) {
      if ((void *)this->m_id == x) {
        c74::max::t_mock_outlet::push(this,s,(long)ac,av);
        return (void *)0x1;
      }
    }
    puVar1 = (undefined8 *)*puVar1;
  } while( true );
}

Assistant:

MOCK_EXPORT void *outlet_anything(void *x, t_symbol *s, short ac, const t_atom *av)
{
    t_ptr_int outlet_id = (t_ptr_int)x;

    for (t_map_object_2_outlet_set::iterator i = g_object_to_outletset.begin(); i != g_object_to_outletset.end(); i++) {
        t_mock_outlets& outletset = i->second;

        for (t_mock_outlet_iter j = outletset.begin(); j != outletset.end(); j++) {
            t_mock_outlet& outlet = *j;

            if (outlet.get_id() == outlet_id) {
                outlet.push(s, ac, av);
                goto done;
            }
        }
    }
done:
    return (void*)1;
}